

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assertion.cpp
# Opt level: O0

void __thiscall
iu_AssertionTest_x_iutest_x_Cpp11_Test::~iu_AssertionTest_x_iutest_x_Cpp11_Test
          (iu_AssertionTest_x_iutest_x_Cpp11_Test *this)

{
  iu_AssertionTest_x_iutest_x_Cpp11_Test *this_local;
  
  iutest::Test::~Test(&this->super_Test);
  return;
}

Assistant:

IUTEST(AssertionTest, Cpp11)
{
#if IUTEST_HAS_CHAR16_T
    const char16_t c16[] = u"test";
    IUTEST_EXPECT_STREQ(c16, u"test");
#endif

#if IUTEST_HAS_CHAR32_T
    const char32_t c32[] = U"test";
    IUTEST_EXPECT_STREQ(c32, U"test");
#endif
}